

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,unsigned_long,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  data_ptr_t pdVar1;
  ulong uVar2;
  sel_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  ulong uVar9;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar1 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar6 = 0;
      uVar9 = 0;
      do {
        puVar8 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar8 == (unsigned_long *)0x0) {
          uVar4 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar4 = count;
          }
LAB_01a79156:
          uVar5 = uVar9;
          if (uVar9 < uVar4) {
            puVar8 = (unsigned_long *)(pdVar1 + uVar9 * 8);
            do {
              BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
              Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
                        ((ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *)state,
                         puVar8,aggr_input_data);
              uVar9 = uVar9 + 1;
              puVar8 = puVar8 + 1;
              uVar5 = uVar4;
            } while (uVar4 != uVar9);
          }
        }
        else {
          uVar2 = puVar8[uVar6];
          uVar4 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar4 = count;
          }
          if (uVar2 == 0xffffffffffffffff) goto LAB_01a79156;
          uVar5 = uVar4;
          if ((uVar2 != 0) && (uVar5 = uVar9, uVar9 < uVar4)) {
            puVar8 = (unsigned_long *)(pdVar1 + uVar9 * 8);
            uVar7 = 0;
            do {
              if ((uVar2 >> (uVar7 & 0x3f) & 1) != 0) {
                BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
                Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
                          ((ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *)state,
                           puVar8,aggr_input_data);
              }
              uVar7 = uVar7 + 1;
              puVar8 = puVar8 + 1;
              uVar5 = uVar4;
            } while (uVar4 - uVar9 != uVar7);
          }
        }
        uVar6 = uVar6 + 1;
        uVar9 = uVar5;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar8 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
      local_78.data = (data_ptr_t)&input->validity;
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      TypedModeFunction<duckdb::ModeStandard<unsigned_long>>::
      ConstantOperation<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
                ((ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *)state,
                 (unsigned_long *)input->data,(AggregateUnaryInput *)&local_78,count);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar3 = (local_78.sel)->sel_vector;
        uVar9 = 0;
        do {
          uVar6 = uVar9;
          if (psVar3 != (sel_t *)0x0) {
            uVar6 = (ulong)psVar3[uVar9];
          }
          BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
          Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
                    ((ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *)state,
                     (unsigned_long *)(local_78.data + uVar6 * 8),aggr_input_data);
          uVar9 = uVar9 + 1;
        } while (count != uVar9);
      }
    }
    else if (count != 0) {
      psVar3 = (local_78.sel)->sel_vector;
      uVar9 = 0;
      do {
        uVar6 = uVar9;
        if (psVar3 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar3[uVar9];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6]
             >> (uVar6 & 0x3f) & 1) != 0)) {
          BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
          Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
                    ((ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *)state,
                     (unsigned_long *)(local_78.data + uVar6 * 8),aggr_input_data);
        }
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}